

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDVertex::ReplaceEdgeInArray(ON_SubDVertex *this,ON_SubDEdge *old_edge,ON_SubDEdgePtr new_edge)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  uint local_3c;
  uint local_2c;
  uint c;
  uint vei;
  ON_SubDEdge *old_edge_local;
  ON_SubDVertex *this_local;
  ON_SubDEdgePtr new_edge_local;
  
  this_local = (ON_SubDVertex *)new_edge.m_ptr;
  if ((this->m_edges == (ON_SubDEdgePtr *)0x0) || (this->m_edge_count == 0)) {
    ON_SubDIncrementErrorCount();
    new_edge_local.m_ptr._4_4_ = 0xffffffff;
  }
  else {
    if (old_edge == (ON_SubDEdge *)0x0) {
      local_3c = 0xffffffff;
    }
    else {
      local_3c = EdgeArrayIndex(this,old_edge);
    }
    local_2c = local_3c;
    if ((local_3c == 0xffffffff) || ((ON_SubDVertex *)this->m_edges[local_3c].m_ptr == this_local))
    {
      new_edge_local.m_ptr._4_4_ = 0xffffffff;
    }
    else {
      bVar2 = ON_SubDEdgePtr::IsNotNull((ON_SubDEdgePtr *)&this_local);
      if (bVar2) {
        this->m_edges[local_3c].m_ptr = (ON__UINT_PTR)this_local;
        uVar3 = local_2c;
      }
      else {
        uVar1 = this->m_edge_count;
        this->m_edge_count = uVar1 - 1;
        while (uVar3 = local_2c + 1, uVar3 < uVar1) {
          this->m_edges[local_2c].m_ptr = this->m_edges[uVar3].m_ptr;
          local_2c = uVar3;
        }
      }
      local_2c = uVar3;
      new_edge_local.m_ptr._4_4_ = local_2c;
    }
  }
  return new_edge_local.m_ptr._4_4_;
}

Assistant:

unsigned int ON_SubDVertex::ReplaceEdgeInArray(
  const ON_SubDEdge* old_edge,
  const ON_SubDEdgePtr new_edge
  )
{
  if (m_edges == nullptr || m_edge_count == 0)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_UINT_INDEX);
  unsigned vei = old_edge != nullptr ? EdgeArrayIndex(old_edge) : ON_UNSET_UINT_INDEX;
  if (ON_UNSET_UINT_INDEX == vei || m_edges[vei].m_ptr == new_edge.m_ptr)
    return ON_UNSET_UINT_INDEX;
  if (new_edge.IsNotNull())
  {
    m_edges[vei] = new_edge;
  }
  else
  {
    const unsigned c = (unsigned)(m_edge_count--);
    while (++vei < c)
      m_edges[vei - 1] = m_edges[vei];
  }
  return vei;
}